

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O0

void count_suite::count_full(void)

{
  initializer_list<int> input;
  undefined4 local_c8;
  int local_c4;
  iterator local_c0;
  basic_iterator<int> local_b0;
  difference_type local_a0 [2];
  undefined4 local_90;
  int local_8c;
  iterator local_88;
  basic_iterator<int> local_78;
  difference_type local_68;
  int local_5c [5];
  iterator local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  memset(&span.member.next,0,0x10);
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  local_5c[0] = 0xb;
  local_5c[1] = 0x16;
  local_5c[2] = 0x21;
  local_5c[3] = 0x2c;
  local_5c[4] = 0x37;
  local_48 = local_5c;
  local_40 = 5;
  input._M_len = 5;
  input._M_array = local_48;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  local_78 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::end
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_8c = 0xb;
  local_68 = std::count<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int>
                       (local_78,local_88,&local_8c);
  local_90 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(span.begin(), span.end(), 11)","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0xe8,"void count_suite::count_full()",&local_68,&local_90);
  local_b0 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_c0 = vista::circular_view<int,_18446744073709551615UL>::end
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_c4 = 0x16;
  local_a0[0] = std::
                count<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int>
                          (local_b0,local_c0,&local_c4);
  local_c8 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count(span.begin(), span.end(), 22)","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0xe9,"void count_suite::count_full()",local_a0,&local_c8);
  return;
}

Assistant:

void count_full()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55 };
    BOOST_TEST_EQ(std::count(span.begin(), span.end(), 11), 0);
    BOOST_TEST_EQ(std::count(span.begin(), span.end(), 22), 1);
}